

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.hpp
# Opt level: O0

string * __thiscall KV::KeyValues::getKey_abi_cxx11_(string *__return_storage_ptr__,KeyValues *this)

{
  KeyValues *this_local;
  
  if (this->key == (string *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getKey() const { return ( key ) ? *key : std::string(); }